

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_udp.cpp
# Opt level: O3

string * __thiscall
miniros::TransportUDP::getTransportInfo_abi_cxx11_
          (string *__return_storage_ptr__,TransportUDP *this)

{
  ostream *poVar1;
  stringstream str;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"UDPROS connection on port ",0x1a);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,this->local_port_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," to [",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->cached_remote_host_)._M_dataplus._M_p,
                      (this->cached_remote_host_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string TransportUDP::getTransportInfo()
{
  std::stringstream str;
  str << "UDPROS connection on port " << local_port_ << " to [" << cached_remote_host_ << "]";
  return str.str();
}